

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::TypedConfigurations::setValue<el::base::SubsecondPrecision>
          (TypedConfigurations *this,Level level,SubsecondPrecision *value,
          map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
          *confMap,bool includeGlobalLevel)

{
  bool bVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  pair<el::Level,_el::base::SubsecondPrecision> *in_RCX;
  mapped_type *in_RDX;
  byte in_R8B;
  pair<el::Level,_el::base::SubsecondPrecision> pVar4;
  iterator it;
  map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
  *in_stack_ffffffffffffff28;
  pair<el::Level,_el::base::SubsecondPrecision> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  undefined1 uVar5;
  key_type *in_stack_ffffffffffffff48;
  map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
  *in_stack_ffffffffffffff50;
  _Self local_80;
  _Base_ptr local_78;
  _Self local_70;
  undefined4 local_64;
  _Self local_60 [3];
  pair<el::Level,_el::base::SubsecondPrecision> local_48;
  undefined4 local_34;
  undefined8 local_30;
  uint local_28;
  byte local_21;
  pair<el::Level,_el::base::SubsecondPrecision> *local_20;
  mapped_type *local_18;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = utils::std::
          map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
          ::empty((map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                   *)0x2794af);
  if ((bVar1) && ((local_21 & 1) != 0)) {
    local_34 = 1;
    pVar4 = std::make_pair<el::Level,el::base::SubsecondPrecision_const&>
                      ((Level *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                       (SubsecondPrecision *)in_stack_ffffffffffffff38);
    local_48._0_8_ = pVar4._0_8_;
    local_30._0_4_ = local_48.first;
    local_30._4_4_ = local_48.second.m_width;
    local_48.second.m_offset = pVar4.second.m_offset;
    local_28 = local_48.second.m_offset;
    local_48 = pVar4;
    std::
    map<el::Level,el::base::SubsecondPrecision,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
    ::insert<std::pair<el::Level,el::base::SubsecondPrecision>>
              ((map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
  }
  else {
    local_64 = 1;
    local_60[0]._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
         ::find(in_stack_ffffffffffffff28,(key_type *)0x279560);
    local_70._M_node =
         (_Base_ptr)
         utils::std::
         map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
         ::end(in_stack_ffffffffffffff28);
    bVar1 = utils::std::operator!=(local_60,&local_70);
    uVar5 = false;
    if (bVar1) {
      ppVar2 = utils::std::
               _Rb_tree_iterator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>::
               operator->((_Rb_tree_iterator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>
                           *)0x27959f);
      uVar5 = SubsecondPrecision::operator==(&ppVar2->second,local_18);
    }
    if ((bool)uVar5 == false) {
      local_78 = (_Base_ptr)
                 utils::std::
                 map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                 ::find(in_stack_ffffffffffffff28,(key_type *)0x2795db);
      local_60[0]._M_node = local_78;
      local_80._M_node =
           (_Base_ptr)
           utils::std::
           map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
           ::end(in_stack_ffffffffffffff28);
      bVar1 = utils::std::operator==(local_60,&local_80);
      if (bVar1) {
        std::make_pair<el::Level&,el::base::SubsecondPrecision_const&>
                  ((Level *)CONCAT17(uVar5,in_stack_ffffffffffffff40),(SubsecondPrecision *)local_20
                  );
        std::
        map<el::Level,el::base::SubsecondPrecision,std::less<el::Level>,std::allocator<std::pair<el::Level_const,el::base::SubsecondPrecision>>>
        ::insert<std::pair<el::Level,el::base::SubsecondPrecision>>
                  ((map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                    *)CONCAT17(uVar5,in_stack_ffffffffffffff40),local_20);
      }
      else {
        pmVar3 = utils::std::
                 map<el::Level,_el::base::SubsecondPrecision,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_el::base::SubsecondPrecision>_>_>
                 ::at(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
        *pmVar3 = *local_18;
      }
    }
  }
  return;
}

Assistant:

void setValue(Level level, const Conf_T& value, std::map<Level, Conf_T>* confMap, bool includeGlobalLevel = true) {
    // If map is empty and we are allowed to add into generic level (Level::Global), do it!
    if (confMap->empty() && includeGlobalLevel) {
      confMap->insert(std::make_pair(Level::Global, value));
      return;
    }
    // If same value exist in generic level already, dont add it to explicit level
    typename std::map<Level, Conf_T>::iterator it = confMap->find(Level::Global);
    if (it != confMap->end() && it->second == value) {
      return;
    }
    // Now make sure we dont double up values if we really need to add it to explicit level
    it = confMap->find(level);
    if (it == confMap->end()) {
      // Value not found for level, add new
      confMap->insert(std::make_pair(level, value));
    } else {
      // Value found, just update value
      confMap->at(level) = value;
    }
  }